

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

bool DoRadiusGive(AActor *self,AActor *thing,PClassActor *item,int amount,double distance,int flags,
                 PClassActor *filter,FName *species,double mindist)

{
  byte *pbVar1;
  player_t *ppVar2;
  PClassActor *pPVar3;
  uint uVar4;
  undefined1 uVar5;
  PClass *pPVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AActor *pAVar8;
  AInventory *this;
  undefined4 extraout_var_01;
  PClass *pPVar9;
  AActor *pAVar10;
  bool bVar11;
  bool bVar12;
  AActor *pAVar13;
  byte bVar14;
  bool bVar15;
  double dVar16;
  FName actorSpecies;
  DVector3 diff;
  undefined1 local_68 [32];
  DVector3 local_48;
  
  pPVar6 = AInventory::RegistrationInfo.MyClass;
  if (thing == self) {
    uVar4 = flags & 1;
joined_r0x003dc7c0:
    if (uVar4 == 0) {
      return false;
    }
  }
  else {
    if (((thing->flags).Value & 0x10000) != 0) {
      uVar4 = (uint)flags >> 0xb & 1;
      goto joined_r0x003dc7c0;
    }
    if (((uint)flags >> 0xd & 1) == 0) {
LAB_003dc74b:
      if ((((flags & 0x20U) == 0) || (((thing->flags).Value & 0x100000) == 0)) &&
         ((((uint)flags >> 0xe & 1) == 0 || (((thing->flags6).Value & 0x40000) == 0)))) {
        if ((flags & 0x1eU) == 0) {
          return false;
        }
        if (thing->health < 1) {
          return false;
        }
        ppVar2 = thing->player;
        if (ppVar2 == (player_t *)0x0) {
          if (((flags & 4U) == 0) || (((thing->flags3).Value & 0x2000) == 0)) {
            if ((flags & 8U) == 0) {
              return false;
            }
            if (((thing->flags3).Value & 0x2000) != 0) {
              return false;
            }
            if ((((thing->flags).Value & 4) == 0) && (((thing->flags6).Value & 0x1000) == 0)) {
              return false;
            }
          }
        }
        else if (((flags & 2U) == 0) || (ppVar2->mo != (APlayerPawn *)thing)) {
          if ((flags & 0x10U) == 0) {
            return false;
          }
          if (ppVar2->mo == (APlayerPawn *)thing) {
            return false;
          }
        }
      }
    }
    else {
      if ((thing->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar7 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
        (thing->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar7);
      }
      pPVar9 = (thing->super_DThinker).super_DObject.Class;
      bVar15 = pPVar9 != (PClass *)0x0;
      if (pPVar9 != pPVar6 && bVar15) {
        do {
          pPVar9 = pPVar9->ParentClass;
          bVar15 = pPVar9 != (PClass *)0x0;
          if (pPVar9 == pPVar6) break;
        } while (pPVar9 != (PClass *)0x0);
      }
      if (!bVar15) goto LAB_003dc74b;
    }
  }
  if ((thing->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar7 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
    (thing->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar7);
  }
  pPVar3 = (PClassActor *)(thing->super_DThinker).super_DObject.Class;
  iVar7 = species->Index;
  AActor::GetSpecies((AActor *)local_68);
  if (iVar7 == 0) {
    bVar15 = true;
  }
  else if (((uint)flags >> 0x10 & 1) == 0) {
    bVar15 = local_68._0_4_ == iVar7;
  }
  else {
    bVar15 = local_68._0_4_ != iVar7;
  }
  bVar12 = filter == (PClassActor *)0x0 || (pPVar3 == filter) != (short)flags < 0;
  if (((uint)flags >> 0x11 & 1) == 0) {
    if (thing != self) {
      uVar5 = bVar12 & bVar15;
joined_r0x003dc85f:
      if (!(bool)uVar5) {
        return false;
      }
    }
  }
  else if (thing != self) {
    uVar5 = bVar12 | bVar15;
    goto joined_r0x003dc85f;
  }
  if ((flags & 0x1c0U) != 0 && thing != self) {
    pAVar8 = (self->target).field_0.p;
    if ((pAVar8 != (AActor *)0x0) &&
       (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (self->target).field_0.p = (AActor *)0x0;
      pAVar8 = (AActor *)0x0;
    }
    bVar15 = (flags & 0x40U) == 0;
    pAVar10 = (self->master).field_0.p;
    if ((pAVar10 != (AActor *)0x0) &&
       (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (self->master).field_0.p = (AActor *)0x0;
      pAVar10 = (AActor *)0x0;
    }
    pAVar13 = (self->tracer).field_0.p;
    if ((pAVar13 != (AActor *)0x0) &&
       (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (self->tracer).field_0.p = (AActor *)0x0;
      pAVar13 = (AActor *)0x0;
    }
    bVar12 = ((uint)flags >> 8 & 1) == 0 || pAVar10 != thing;
    bVar11 = -1 < (char)flags || pAVar13 != thing;
    if (((uint)flags >> 0xc & 1) == 0) {
      if (!bVar15 && pAVar8 == thing) {
        return false;
      }
      bVar12 = bVar12 && bVar11;
    }
    else {
      if (bVar15 || pAVar8 != thing) goto LAB_003dc881;
      bVar12 = bVar12 || bVar11;
    }
    if (!bVar12) {
      return false;
    }
  }
LAB_003dc881:
  AActor::Vec3To(&local_48,self,thing);
  local_48.Z = thing->Height * 0.5 + local_48.Z;
  if (((uint)flags >> 9 & 1) == 0) {
    dVar16 = local_48.Z * local_48.Z + local_48.Y * local_48.Y + local_48.X * local_48.X;
    bVar14 = 1;
    if ((dVar16 <= distance * distance) &&
       (((mindist == 0.0 && (!NAN(mindist))) || (mindist * mindist <= dVar16)))) {
LAB_003dca34:
      if ((((uint)flags >> 10 & 1) != 0) || (bVar15 = P_CheckSight(thing,self,9), bVar15)) {
        local_68._0_8_ = (_func_int **)0x0;
        local_68._8_8_ = (PClass *)0x0;
        local_68._16_8_ = (DObject *)0x0;
        this = (AInventory *)AActor::StaticSpawn(item,(DVector3 *)local_68,NO_REPLACE,false);
        pPVar6 = AHealth::RegistrationInfo.MyClass;
        if ((this->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
          iVar7 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
          (this->super_AActor).super_DThinker.super_DObject.Class =
               (PClass *)CONCAT44(extraout_var_01,iVar7);
        }
        pPVar9 = (this->super_AActor).super_DThinker.super_DObject.Class;
        bVar15 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar6 && bVar15) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar15 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar6) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (bVar15) {
          amount = amount * this->Amount;
        }
        this->Amount = amount;
        pbVar1 = (byte *)((long)&(this->super_AActor).flags.Value + 2);
        *pbVar1 = *pbVar1 | 2;
        AActor::ClearCounters((AActor *)this);
        bVar15 = AInventory::CallTryPickup(this,thing,(AActor **)0x0);
        bVar14 = 1;
        if (!bVar15) {
          (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
        }
        goto LAB_003dcb78;
      }
      bVar14 = 0;
    }
  }
  else {
    bVar15 = false;
    bVar14 = 1;
    if (((distance < ABS(local_48.X)) || (distance < ABS(local_48.Y))) ||
       (distance < ABS(local_48.Z))) goto LAB_003dcb78;
    if (((mindist == 0.0) && (!NAN(mindist))) ||
       ((mindist <= ABS(local_48.X) ||
        ((mindist <= ABS(local_48.Y) || (bVar14 = 1, mindist <= ABS(local_48.Z)))))))
    goto LAB_003dca34;
  }
  bVar15 = false;
LAB_003dcb78:
  return (bool)(bVar14 & bVar15);
}

Assistant:

static bool DoRadiusGive(AActor *self, AActor *thing, PClassActor *item, int amount, double distance, int flags, PClassActor *filter, FName species, double mindist)
{
	
	bool doPass = false;
	// Always allow self to give, no matter what other flags are specified. Otherwise, not at all.
	if (thing == self)
	{
		if (!(flags & RGF_GIVESELF))
			return false;
		doPass = true;
	}
	else if (thing->flags & MF_MISSILE)
	{
		if (!(flags & RGF_MISSILES))
			return false;
		doPass = true;
	}
	else if (((flags & RGF_ITEMS) && thing->IsKindOf(RUNTIME_CLASS(AInventory))) ||
			((flags & RGF_CORPSES) && thing->flags & MF_CORPSE) ||
			((flags & RGF_KILLED) && thing->flags6 & MF6_KILLED))
	{
		doPass = true;
	}
	else if ((flags & (RGF_MONSTERS | RGF_OBJECTS | RGF_PLAYERS | RGF_VOODOO)))
	{
		// Make sure it's alive as we're not looking for corpses or killed here.
		if (!doPass && thing->health > 0)
		{
			if (thing->player != nullptr)
			{
				if (((flags & RGF_PLAYERS) && (thing->player->mo == thing)) ||
					((flags & RGF_VOODOO) && (thing->player->mo != thing)))
				{
					doPass = true;
				}
			}
			else
			{
				if (((flags & RGF_MONSTERS) && (thing->flags3 & MF3_ISMONSTER)) ||
					((flags & RGF_OBJECTS) && (!(thing->flags3 & MF3_ISMONSTER)) &&
					(thing->flags & MF_SHOOTABLE || thing->flags6 & MF6_VULNERABLE)))
				{
					doPass = true;
				}
			}
		}
	}

	// Nothing matched up so don't bother with the rest.
	if (!doPass)
		return false;

	//[MC] Check for a filter, species, and the related exfilter/expecies/either flag(s).
	bool filterpass = DoCheckClass(thing, filter, !!(flags & RGF_EXFILTER)),
		speciespass = DoCheckSpecies(thing, species, !!(flags & RGF_EXSPECIES));

	if ((flags & RGF_EITHER) ? (!(filterpass || speciespass)) : (!(filterpass && speciespass)))
	{
		if (thing != self)      //Don't let filter and species obstruct RGF_GIVESELF.
			return false;
	}

	if ((thing != self) && (flags & (RGF_NOTARGET | RGF_NOMASTER | RGF_NOTRACER)))
	{
		//Check for target, master, and tracer flagging.
		bool targetPass = true;
		bool masterPass = true;
		bool tracerPass = true;
		bool ptrPass = false;

		if ((thing == self->target) && (flags & RGF_NOTARGET))
			targetPass = false;
		if ((thing == self->master) && (flags & RGF_NOMASTER))
			masterPass = false;
		if ((thing == self->tracer) && (flags & RGF_NOTRACER))
			tracerPass = false;

		ptrPass = (flags & RGF_INCLUSIVE) ? (targetPass || masterPass || tracerPass) : (targetPass && masterPass && tracerPass);

		//We should not care about what the actor is here. It's safe to abort this actor.
		if (!ptrPass)
			return false;
	}

	if (doPass)
	{
		DVector3 diff = self->Vec3To(thing);
		diff.Z += thing->Height *0.5;
		if (flags & RGF_CUBE)
		{ // check if inside a cube
			double dx = fabs(diff.X);
			double dy = fabs(diff.Y);
			double dz = fabs(diff.Z);
			if ((dx > distance || dy > distance || dz > distance) || (mindist && (dx < mindist && dy < mindist && dz < mindist)))
			{
				return false;
			}
		}
		else
		{ // check if inside a sphere
			double lengthsquared = diff.LengthSquared();
			if (lengthsquared > distance*distance || (mindist && (lengthsquared < mindist*mindist)))
			{
				return false;
			}
		}

		if ((flags & RGF_NOSIGHT) || P_CheckSight(thing, self, SF_IGNOREVISIBILITY | SF_IGNOREWATERBOUNDARY))
		{ // OK to give; target is in direct path, or the monster doesn't care about it being in line of sight.
			AInventory *gift = static_cast<AInventory *>(Spawn(item));
			if (gift->IsKindOf(RUNTIME_CLASS(AHealth)))
			{
				gift->Amount *= amount;
			}
			else
			{
				gift->Amount = amount;
			}
			gift->flags |= MF_DROPPED;
			gift->ClearCounters();
			if (!gift->CallTryPickup(thing))
			{
				gift->Destroy();
				return false;
			}
			else
			{
				return true;
			}
		}
	}
	return false;
}